

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execAdda<(moira::Instr)5,(moira::Mode)5,(moira::Size)2>(Moira *this,u16 opcode)

{
  int iVar1;
  bool bVar2;
  undefined8 in_RAX;
  ulong uVar3;
  int iVar4;
  u32 data;
  u32 ea;
  
  _data = in_RAX;
  bVar2 = readOp<(moira::Mode)5,(moira::Size)2,128ul>(this,opcode & 7,&ea,&data);
  if (bVar2) {
    uVar3 = (ulong)(opcode >> 9 & 7);
    iVar4 = (int)(short)data;
    _data = CONCAT44(ea,iVar4);
    iVar1 = *(int *)((long)this->exec + uVar3 * 4 + -0x38);
    prefetch<4ul>(this);
    (*this->_vptr_Moira[0x19])(this,2);
    (*this->_vptr_Moira[0x19])(this,2);
    *(int *)((long)this->exec + uVar3 * 4 + -0x38) = iVar4 + iVar1;
  }
  return;
}

Assistant:

void
Moira::execAdda(u16 opcode)
{
    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;
    data = SEXT<S>(data);

    result = (I == ADDA) ? readA(dst) + data : readA(dst) - data;
    prefetch<POLLIPL>();

    sync(2);
    if (S == Word || isRegMode(M) || isImmMode(M)) sync(2);
    writeA(dst, result);
}